

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O1

void __thiscall
handlegraph::algorithms::SubHandleGraph::add_handle(SubHandleGraph *this,handle_t *handle)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  __hashtable *__h;
  nid_t node_id;
  __node_gen_type __node_gen;
  long local_18;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  *local_10;
  
  iVar1 = (*this->super->_vptr_HandleGraph[4])();
  local_18 = CONCAT44(extraout_var,iVar1);
  lVar2 = this->min_id;
  if (local_18 <= this->min_id) {
    lVar2 = local_18;
  }
  this->min_id = lVar2;
  lVar2 = this->max_id;
  if (this->max_id <= local_18) {
    lVar2 = local_18;
  }
  this->max_id = lVar2;
  local_10 = &this->contents;
  std::
  _Hashtable<long_long,long_long,std::allocator<long_long>,std::__detail::_Identity,std::equal_to<long_long>,std::hash<long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<long_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long_long,false>>>>
            ((_Hashtable<long_long,long_long,std::allocator<long_long>,std::__detail::_Identity,std::equal_to<long_long>,std::hash<long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_10,&local_18);
  return;
}

Assistant:

void SubHandleGraph::add_handle(const handle_t& handle) {
    
    nid_t node_id = super->get_id(handle);
    
    min_id = min(node_id, min_id);
    max_id = max(node_id, max_id);
    
    contents.insert(node_id);
}